

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationIterator::nextCE32FromContraction
          (CollationIterator *this,CollationData *d,uint32_t contractionCE32,UChar *p,uint32_t ce32,
          UChar32 c,UErrorCode *errorCode)

{
  UChar UVar1;
  SkippedState *pSVar2;
  uint16_t uVar3;
  UStringTrieResult UVar4;
  UChar32 UVar5;
  UChar *pUVar6;
  uint uVar7;
  int32_t n;
  int iVar8;
  int lookAhead;
  UCharsTrie suffixes;
  UCharsTrie local_58;
  UChar *local_38;
  
  local_58.ownedArray_ = (char16_t *)0x0;
  local_58.remainingMatchLength_ = -1;
  pSVar2 = this->skipped;
  if ((pSVar2 != (SkippedState *)0x0) &&
     (0x1f < (ushort)(pSVar2->oldBuffer).fUnion.fStackFields.fLengthAndFlags)) {
    (pSVar2->state).uchars = p;
    (pSVar2->state).pos = p;
    (pSVar2->state).remainingMatchLength = -1;
  }
  local_58.uchars_ = p;
  local_58.pos_ = p;
  local_38 = p;
  UVar4 = UCharsTrie::firstForCodePoint(&local_58,c);
  n = 1;
  iVar8 = 2;
  while (1 < (int)UVar4) {
    pUVar6 = local_58.pos_ + 1;
    UVar1 = *local_58.pos_;
    if (UVar1 < L'\0') {
      ce32 = (ushort)UVar1 & 0x7fff;
      if (0x3fff < ce32) {
        if (ce32 == 0x7fff) {
          uVar7 = (uint)(ushort)local_58.pos_[1] << 0x10;
          pUVar6 = local_58.pos_ + 2;
        }
        else {
          uVar7 = ce32 * 0x10000 + 0xc0000000;
        }
        ce32 = (ushort)*pUVar6 | uVar7;
      }
    }
    else if ((ushort)UVar1 < 0x4040) {
      ce32 = ((ushort)UVar1 >> 6) - 1;
    }
    else if ((ushort)UVar1 < 0x7fc0) {
      ce32 = ((ushort)UVar1 & 0x7fc0) * 0x400 + (uint)(ushort)*pUVar6 + 0xfeff0000;
    }
    else {
      ce32 = CONCAT22(local_58.pos_[1],local_58.pos_[2]);
    }
    if ((UVar4 & USTRINGTRIE_NO_VALUE) == USTRINGTRIE_NO_MATCH) goto LAB_00230ca6;
    c = nextSkippedCodePoint(this,errorCode);
    if (c < 0) goto LAB_00230ca6;
    pSVar2 = this->skipped;
    n = 1;
    if ((pSVar2 != (SkippedState *)0x0) &&
       (0x1f < (ushort)(pSVar2->oldBuffer).fUnion.fStackFields.fLengthAndFlags)) {
      (pSVar2->state).uchars = local_58.uchars_;
      (pSVar2->state).pos = local_58.pos_;
      (pSVar2->state).remainingMatchLength = local_58.remainingMatchLength_;
    }
LAB_00230be0:
    UVar4 = UCharsTrie::nextForCodePoint(&local_58,c);
    iVar8 = iVar8 + 1;
  }
  if (UVar4 != USTRINGTRIE_NO_MATCH) {
    UVar5 = nextSkippedCodePoint(this,errorCode);
    if (-1 < UVar5) {
      n = n + 1;
      c = UVar5;
      goto LAB_00230be0;
    }
  }
  if (((contractionCE32 >> 10 & 1) != 0) &&
     (lookAhead = iVar8 + -1, n < lookAhead || (contractionCE32 >> 8 & 1) == 0)) {
    if (1 < n) {
      backwardNumSkipped(this,n,errorCode);
      c = nextSkippedCodePoint(this,errorCode);
      lookAhead = iVar8 - n;
      n = 1;
    }
    uVar3 = Normalizer2Impl::getFCD16(d->nfcImpl,c);
    if (0xff < uVar3) {
      ce32 = nextCE32FromDiscontiguousContraction(this,d,&local_58,ce32,lookAhead,c,errorCode);
      goto LAB_00230ca6;
    }
  }
  backwardNumSkipped(this,n,errorCode);
LAB_00230ca6:
  UCharsTrie::~UCharsTrie(&local_58);
  return ce32;
}

Assistant:

uint32_t
CollationIterator::nextCE32FromContraction(const CollationData *d, uint32_t contractionCE32,
                                           const UChar *p, uint32_t ce32, UChar32 c,
                                           UErrorCode &errorCode) {
    // c: next code point after the original one

    // Number of code points read beyond the original code point.
    // Needed for discontiguous contraction matching.
    int32_t lookAhead = 1;
    // Number of code points read since the last match (initially only c).
    int32_t sinceMatch = 1;
    // Normally we only need a contiguous match,
    // and therefore need not remember the suffixes state from before a mismatch for retrying.
    // If we are already processing skipped combining marks, then we do track the state.
    UCharsTrie suffixes(p);
    if(skipped != NULL && !skipped->isEmpty()) { skipped->saveTrieState(suffixes); }
    UStringTrieResult match = suffixes.firstForCodePoint(c);
    for(;;) {
        UChar32 nextCp;
        if(USTRINGTRIE_HAS_VALUE(match)) {
            ce32 = (uint32_t)suffixes.getValue();
            if(!USTRINGTRIE_HAS_NEXT(match) || (c = nextSkippedCodePoint(errorCode)) < 0) {
                return ce32;
            }
            if(skipped != NULL && !skipped->isEmpty()) { skipped->saveTrieState(suffixes); }
            sinceMatch = 1;
        } else if(match == USTRINGTRIE_NO_MATCH || (nextCp = nextSkippedCodePoint(errorCode)) < 0) {
            // No match for c, or partial match (USTRINGTRIE_NO_VALUE) and no further text.
            // Back up if necessary, and try a discontiguous contraction.
            if((contractionCE32 & Collation::CONTRACT_TRAILING_CCC) != 0 &&
                    // Discontiguous contraction matching extends an existing match.
                    // If there is no match yet, then there is nothing to do.
                    ((contractionCE32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) == 0 ||
                        sinceMatch < lookAhead)) {
                // The last character of at least one suffix has lccc!=0,
                // allowing for discontiguous contractions.
                // UCA S2.1.1 only processes non-starters immediately following
                // "a match in the table" (sinceMatch=1).
                if(sinceMatch > 1) {
                    // Return to the state after the last match.
                    // (Return to sinceMatch=0 and re-fetch the first partially-matched character.)
                    backwardNumSkipped(sinceMatch, errorCode);
                    c = nextSkippedCodePoint(errorCode);
                    lookAhead -= sinceMatch - 1;
                    sinceMatch = 1;
                }
                if(d->getFCD16(c) > 0xff) {
                    return nextCE32FromDiscontiguousContraction(
                        d, suffixes, ce32, lookAhead, c, errorCode);
                }
            }
            break;
        } else {
            // Continue after partial match (USTRINGTRIE_NO_VALUE) for c.
            // It does not have a result value, therefore it is not itself "a match in the table".
            // If a partially-matched c has ccc!=0 then
            // it might be skipped in discontiguous contraction.
            c = nextCp;
            ++sinceMatch;
        }
        ++lookAhead;
        match = suffixes.nextForCodePoint(c);
    }
    backwardNumSkipped(sinceMatch, errorCode);
    return ce32;
}